

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

double libaom_examples::depth_representation_element_to_double(DepthRepresentationElement *e)

{
  byte bVar1;
  byte *in_RDI;
  __type _Var2;
  int in_stack_ffffffffffffffdc;
  double in_stack_ffffffffffffffe0;
  double local_8;
  
  if (in_RDI[1] == 0) {
    local_8 = (double)((-(*in_RDI & 1) | 1) * *(int *)(in_RDI + 4));
    _Var2 = std::pow<double,int>(local_8,in_stack_ffffffffffffffdc);
    local_8 = local_8 * _Var2;
  }
  else {
    bVar1 = *in_RDI;
    _Var2 = std::pow<double,int>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    local_8 = (double)(int)(-(bVar1 & 1) | 1) * _Var2 *
              ((double)*(uint *)(in_RDI + 4) / (double)(1L << (in_RDI[2] & 0x3f)) + 1.0);
  }
  return local_8;
}

Assistant:

double depth_representation_element_to_double(
    const DepthRepresentationElement &e) {
  // Let x be a variable that is computed using four variables s, e, m, and n,
  // as follows: If e is greater than 0 and less than 127, x is set equal to
  // (−1)^s*2^(e−31) * (1+m÷2^n).
  // Otherwise (e is equal to 0), x is set equal to (−1)^s*2^−(30+n)*m.
  if (e.exponent > 0) {
    return (e.sign_flag ? -1 : 1) * std::pow(2.0, e.exponent - 31) *
           (1 + static_cast<double>(e.mantissa) /
                    (static_cast<int64_t>(1) << e.mantissa_len));
  } else {
    return (e.sign_flag ? -1 : 1) * e.mantissa *
           std::pow(2.0, -30 + e.mantissa_len);
  }
}